

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O1

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::register_handler
          (Reactor<iqnet::Null_lock> *this,Event_handler *eh,Event_mask mask)

{
  _Rb_tree_header *p_Var1;
  ushort *puVar2;
  size_t *psVar3;
  int iVar4;
  _List_node_base *p_Var5;
  mapped_type *ppEVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  Handler fd;
  key_type local_34;
  
  iVar4 = (*eh->_vptr_Event_handler[2])(eh);
  if ((char)iVar4 != '\0') {
    this->num_stoppers = this->num_stoppers + 1;
  }
  iVar4 = (*eh->_vptr_Event_handler[9])(eh);
  p_Var1 = &(this->handlers)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var1->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < iVar4]) {
    if (iVar4 <= (int)p_Var8[1]._M_color) {
      p_Var7 = p_Var8;
    }
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var8 = p_Var7, iVar4 < (int)p_Var7[1]._M_color)) {
    p_Var8 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)(CONCAT44(mask,iVar4) & 0xffffffffffff);
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar3 = &(this->handlers_states).
              super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
              ._M_impl._M_node._M_size;
    *psVar3 = *psVar3 + 1;
    ppEVar6 = std::
              map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
              ::operator[](&this->handlers,&local_34);
    *ppEVar6 = eh;
  }
  else {
    p_Var5 = (this->handlers_states).
             super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    iVar4 = (*eh->_vptr_Event_handler[9])(eh);
    for (; (p_Var5 != (_List_node_base *)&this->handlers_states &&
           (*(int *)&p_Var5[1]._M_next != iVar4)); p_Var5 = p_Var5->_M_next) {
    }
    puVar2 = (ushort *)((long)&p_Var5[1]._M_next + 4);
    *puVar2 = *puVar2 | (ushort)mask;
  }
  return;
}

Assistant:

void Reactor<Lock>::register_handler( Event_handler* eh, Event_mask mask )
{
  scoped_lock lk(lock);

  if (eh->is_stopper())
    num_stoppers++;

  Socket::Handler fd = eh->get_handler();

  if( handlers.find(fd) == handlers.end() )
  {
    handlers_states.push_back( HandlerState(fd, mask) );
    handlers[fd] = eh;
  }
  else
  {
    typename Reactor<Lock>::hs_iterator i = find_handler_state(eh);
    i->mask |= mask;
  }
}